

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_main_loop__pulse(ma_device *pDevice)

{
  ma_uint32 mVar1;
  bool bVar2;
  ma_uint32 mVar3;
  ma_uint32 mVar4;
  uint local_6108;
  uint local_6104;
  ma_uint32 local_60f0;
  ma_uint32 local_60ec;
  ma_uint32 framesToWriteThisIteration;
  ma_uint32 framesProcessed_1;
  ma_uint32 framesRemainingInPeriod_1;
  ma_uint32 framesWrittenThisPeriod;
  ma_uint32 periodSizeInFrames_1;
  ma_uint32 intermediaryBufferSizeInFrames_1;
  ma_uint8 intermediaryBuffer_1 [4096];
  ma_uint32 local_50d0;
  ma_uint32 local_50cc;
  ma_uint32 framesToReadThisIteration;
  ma_uint32 framesProcessed;
  ma_uint32 framesRemainingInPeriod;
  ma_uint32 framesReadThisPeriod;
  ma_uint32 periodSizeInFrames;
  ma_uint32 intermediaryBufferSizeInFrames;
  ma_uint8 intermediaryBuffer [4096];
  ma_uint64 convertedDeviceFrameCount;
  ma_uint64 convertedClientFrameCount;
  ma_uint8 *pRunningCapturedDeviceFrames;
  ma_uint64 capturedDeviceFramesToProcessThisIteration;
  ma_uint64 capturedClientFramesToProcessThisIteration;
  ma_uint32 playbackClientDataCapInFrames;
  ma_uint32 capturedClientDataCapInFrames;
  ma_uint8 playbackClientData [4096];
  ma_uint8 capturedClientData [4096];
  ma_uint32 local_2080;
  ma_uint32 local_207c;
  ma_uint32 capturedDeviceFramesToTryProcessing;
  ma_uint32 capturedDeviceFramesToProcess;
  ma_uint32 capturedDeviceFramesProcessed;
  ma_uint32 capturedDeviceFramesRemaining;
  ma_uint32 playbackDeviceDataCapInFrames;
  ma_uint32 capturedDeviceDataCapInFrames;
  ma_uint8 playbackDeviceData [4096];
  ma_uint8 capturedDeviceData [4096];
  ma_uint32 capturedDevicePeriodSizeInFrames;
  ma_uint32 totalCapturedDeviceFramesProcessed;
  ma_bool32 exitLoop;
  ma_result result;
  ma_device *pDevice_local;
  
  totalCapturedDeviceFramesProcessed = 0;
  bVar2 = false;
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4eab,"ma_result ma_device_main_loop__pulse(ma_device *)");
  }
  if ((((pDevice->type != ma_device_type_capture) && (pDevice->type != ma_device_type_duplex)) ||
      (totalCapturedDeviceFramesProcessed =
            ma_device__cork_stream__pulse(pDevice,ma_device_type_capture,0),
      pDevice_local._4_4_ = totalCapturedDeviceFramesProcessed,
      totalCapturedDeviceFramesProcessed == 0)) &&
     (((pDevice->type != ma_device_type_playback && (pDevice->type != ma_device_type_duplex)) ||
      (totalCapturedDeviceFramesProcessed =
            ma_device__cork_stream__pulse(pDevice,ma_device_type_playback,0),
      pDevice_local._4_4_ = totalCapturedDeviceFramesProcessed,
      totalCapturedDeviceFramesProcessed == 0)))) {
switchD_00118ab5_default:
    if (pDevice->state == 2 && !bVar2) {
      switch(pDevice->type) {
      case ma_device_type_playback:
        mVar1 = (pDevice->playback).internalChannels;
        mVar3 = ma_get_bytes_per_sample((pDevice->playback).internalFormat);
        framesWrittenThisPeriod =
             SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
        framesRemainingInPeriod_1 = (pDevice->playback).internalPeriodSizeInFrames;
        for (framesProcessed_1 = 0; framesProcessed_1 < framesRemainingInPeriod_1;
            framesProcessed_1 = local_60ec + framesProcessed_1) {
          framesToWriteThisIteration = framesRemainingInPeriod_1 - framesProcessed_1;
          local_60f0 = framesToWriteThisIteration;
          if (framesWrittenThisPeriod < framesToWriteThisIteration) {
            local_60f0 = framesWrittenThisPeriod;
          }
          ma_device__read_frames_from_client(pDevice,local_60f0,&periodSizeInFrames_1);
          totalCapturedDeviceFramesProcessed =
               ma_device_write__pulse(pDevice,&periodSizeInFrames_1,local_60f0,&local_60ec);
          if (totalCapturedDeviceFramesProcessed != 0) {
            bVar2 = true;
            break;
          }
        }
        break;
      case ma_device_type_capture:
        mVar1 = (pDevice->capture).internalChannels;
        mVar3 = ma_get_bytes_per_sample((pDevice->capture).internalFormat);
        framesReadThisPeriod =
             SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
        framesRemainingInPeriod = (pDevice->capture).internalPeriodSizeInFrames;
        for (framesProcessed = 0; framesProcessed < framesRemainingInPeriod;
            framesProcessed = local_50cc + framesProcessed) {
          framesToReadThisIteration = framesRemainingInPeriod - framesProcessed;
          local_50d0 = framesToReadThisIteration;
          if (framesReadThisPeriod < framesToReadThisIteration) {
            local_50d0 = framesReadThisPeriod;
          }
          totalCapturedDeviceFramesProcessed =
               ma_device_read__pulse(pDevice,&periodSizeInFrames,local_50d0,&local_50cc);
          if (totalCapturedDeviceFramesProcessed != 0) {
            bVar2 = true;
            break;
          }
          ma_device__send_frames_to_client(pDevice,local_50cc,&periodSizeInFrames);
        }
        break;
      case ma_device_type_duplex:
        capturedDeviceData[0xffc] = '\0';
        capturedDeviceData[0xffd] = '\0';
        capturedDeviceData[0xffe] = '\0';
        capturedDeviceData[0xfff] = '\0';
        if ((pDevice->capture).internalPeriodSizeInFrames <
            (pDevice->playback).internalPeriodSizeInFrames) {
          local_6104 = (pDevice->capture).internalPeriodSizeInFrames;
        }
        else {
          local_6104 = (pDevice->playback).internalPeriodSizeInFrames;
        }
        for (; (uint)capturedDeviceData._4092_4_ < local_6104;
            capturedDeviceData._4092_4_ =
                 capturedDeviceFramesToTryProcessing + capturedDeviceData._4092_4_) {
          mVar1 = (pDevice->capture).internalChannels;
          mVar3 = ma_get_bytes_per_sample((pDevice->capture).internalFormat);
          capturedDeviceFramesRemaining =
               SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
          mVar1 = (pDevice->playback).internalChannels;
          mVar3 = ma_get_bytes_per_sample((pDevice->playback).internalFormat);
          capturedDeviceFramesProcessed =
               SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
          local_2080 = local_6104 - capturedDeviceData._4092_4_;
          if (capturedDeviceFramesRemaining < local_2080) {
            local_2080 = capturedDeviceFramesRemaining;
          }
          totalCapturedDeviceFramesProcessed =
               ma_device_read__pulse(pDevice,playbackDeviceData + 0xff8,local_2080,&local_207c);
          if (totalCapturedDeviceFramesProcessed != 0) {
            bVar2 = true;
            break;
          }
          capturedDeviceFramesToProcess = local_207c;
          capturedDeviceFramesToTryProcessing = 0;
          do {
            mVar1 = (pDevice->capture).channels;
            mVar3 = ma_get_bytes_per_sample((pDevice->capture).format);
            capturedClientFramesToProcessThisIteration._4_4_ =
                 SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
            mVar1 = (pDevice->playback).channels;
            mVar4 = ma_get_bytes_per_sample((pDevice->playback).format);
            mVar3 = capturedDeviceFramesToTryProcessing;
            capturedClientFramesToProcessThisIteration._0_4_ =
                 SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar4 * mVar1),0);
            local_6108 = (uint)capturedClientFramesToProcessThisIteration;
            if (capturedClientFramesToProcessThisIteration._4_4_ <
                (uint)capturedClientFramesToProcessThisIteration) {
              local_6108 = capturedClientFramesToProcessThisIteration._4_4_;
            }
            capturedDeviceFramesToProcessThisIteration = (ma_uint64)local_6108;
            pRunningCapturedDeviceFrames = (ma_uint8 *)(ulong)capturedDeviceFramesToProcess;
            mVar1 = (pDevice->capture).internalChannels;
            mVar4 = ma_get_bytes_per_sample((pDevice->capture).internalFormat);
            convertedClientFrameCount =
                 (ma_uint64)(playbackDeviceData + (ulong)(mVar3 * mVar4 * mVar1) + 0xff8);
            totalCapturedDeviceFramesProcessed =
                 ma_data_converter_process_pcm_frames
                           (&(pDevice->capture).converter,(void *)convertedClientFrameCount,
                            (ma_uint64 *)&pRunningCapturedDeviceFrames,playbackClientData + 0xff8,
                            &capturedDeviceFramesToProcessThisIteration);
            if ((totalCapturedDeviceFramesProcessed != 0) ||
               (capturedDeviceFramesToProcessThisIteration == 0)) goto LAB_00118e66;
            ma_device__on_data(pDevice,&playbackClientDataCapInFrames,playbackClientData + 0xff8,
                               (ma_uint32)capturedDeviceFramesToProcessThisIteration);
            capturedDeviceFramesToTryProcessing =
                 (int)pRunningCapturedDeviceFrames + capturedDeviceFramesToTryProcessing;
            capturedDeviceFramesToProcess =
                 capturedDeviceFramesToProcess - (int)pRunningCapturedDeviceFrames;
            do {
              convertedDeviceFrameCount = capturedDeviceFramesToProcessThisIteration;
              intermediaryBuffer._4088_8_ = ZEXT48(capturedDeviceFramesProcessed);
              totalCapturedDeviceFramesProcessed =
                   ma_data_converter_process_pcm_frames
                             (&(pDevice->playback).converter,&playbackClientDataCapInFrames,
                              &convertedDeviceFrameCount,&playbackDeviceDataCapInFrames,
                              (ma_uint64 *)(intermediaryBuffer + 0xff8));
              if (totalCapturedDeviceFramesProcessed != 0) break;
              totalCapturedDeviceFramesProcessed =
                   ma_device_write__pulse
                             (pDevice,&playbackDeviceDataCapInFrames,
                              (ma_uint32)intermediaryBuffer._4088_8_,(ma_uint32 *)0x0);
              if (totalCapturedDeviceFramesProcessed != 0) {
                bVar2 = true;
                break;
              }
              capturedDeviceFramesToProcessThisIteration =
                   capturedDeviceFramesToProcessThisIteration -
                   (convertedDeviceFrameCount & 0xffffffff);
            } while (capturedDeviceFramesToProcessThisIteration != 0);
          } while (totalCapturedDeviceFramesProcessed == 0);
          bVar2 = true;
LAB_00118e66:
        }
        break;
      case ma_device_type_loopback:
      }
      goto switchD_00118ab5_default;
    }
    ma_device_stop__pulse(pDevice);
    pDevice_local._4_4_ = totalCapturedDeviceFramesProcessed;
  }
  return pDevice_local._4_4_;
}

Assistant:

static ma_result ma_device_main_loop__pulse(ma_device* pDevice)
{
    ma_result result = MA_SUCCESS;
    ma_bool32 exitLoop = MA_FALSE;

    MA_ASSERT(pDevice != NULL);

    /* The stream needs to be uncorked first. We do this at the top for both capture and playback for PulseAudio. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_capture, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_playback, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }


    while (ma_device__get_state(pDevice) == MA_STATE_STARTED && !exitLoop) {
        switch (pDevice->type)
        {
            case ma_device_type_duplex:
            {
                /* The process is: device_read -> convert -> callback -> convert -> device_write */
                ma_uint32 totalCapturedDeviceFramesProcessed = 0;
                ma_uint32 capturedDevicePeriodSizeInFrames = ma_min(pDevice->capture.internalPeriodSizeInFrames, pDevice->playback.internalPeriodSizeInFrames);
                    
                while (totalCapturedDeviceFramesProcessed < capturedDevicePeriodSizeInFrames) {
                    ma_uint8  capturedDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint8  playbackDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 capturedDeviceDataCapInFrames = sizeof(capturedDeviceData) / ma_get_bytes_per_frame(pDevice->capture.internalFormat,  pDevice->capture.internalChannels);
                    ma_uint32 playbackDeviceDataCapInFrames = sizeof(playbackDeviceData) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    ma_uint32 capturedDeviceFramesRemaining;
                    ma_uint32 capturedDeviceFramesProcessed;
                    ma_uint32 capturedDeviceFramesToProcess;
                    ma_uint32 capturedDeviceFramesToTryProcessing = capturedDevicePeriodSizeInFrames - totalCapturedDeviceFramesProcessed;
                    if (capturedDeviceFramesToTryProcessing > capturedDeviceDataCapInFrames) {
                        capturedDeviceFramesToTryProcessing = capturedDeviceDataCapInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, capturedDeviceData, capturedDeviceFramesToTryProcessing, &capturedDeviceFramesToProcess);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    capturedDeviceFramesRemaining = capturedDeviceFramesToProcess;
                    capturedDeviceFramesProcessed = 0;

                    for (;;) {
                        ma_uint8  capturedClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint8  playbackClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint32 capturedClientDataCapInFrames = sizeof(capturedClientData) / ma_get_bytes_per_frame(pDevice->capture.format, pDevice->capture.channels);
                        ma_uint32 playbackClientDataCapInFrames = sizeof(playbackClientData) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
                        ma_uint64 capturedClientFramesToProcessThisIteration = ma_min(capturedClientDataCapInFrames, playbackClientDataCapInFrames);
                        ma_uint64 capturedDeviceFramesToProcessThisIteration = capturedDeviceFramesRemaining;
                        ma_uint8* pRunningCapturedDeviceFrames = ma_offset_ptr(capturedDeviceData, capturedDeviceFramesProcessed * ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels));

                        /* Convert capture data from device format to client format. */
                        result = ma_data_converter_process_pcm_frames(&pDevice->capture.converter, pRunningCapturedDeviceFrames, &capturedDeviceFramesToProcessThisIteration, capturedClientData, &capturedClientFramesToProcessThisIteration);
                        if (result != MA_SUCCESS) {
                            break;
                        }

                        /*
                        If we weren't able to generate any output frames it must mean we've exhaused all of our input. The only time this would not be the case is if capturedClientData was too small
                        which should never be the case when it's of the size MA_DATA_CONVERTER_STACK_BUFFER_SIZE.
                        */
                        if (capturedClientFramesToProcessThisIteration == 0) {
                            break;
                        }

                        ma_device__on_data(pDevice, playbackClientData, capturedClientData, (ma_uint32)capturedClientFramesToProcessThisIteration);    /* Safe cast .*/

                        capturedDeviceFramesProcessed += (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */
                        capturedDeviceFramesRemaining -= (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */

                        /* At this point the playbackClientData buffer should be holding data that needs to be written to the device. */
                        for (;;) {
                            ma_uint64 convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
                            ma_uint64 convertedDeviceFrameCount = playbackDeviceDataCapInFrames;
                            result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, playbackClientData, &convertedClientFrameCount, playbackDeviceData, &convertedDeviceFrameCount);
                            if (result != MA_SUCCESS) {
                                break;
                            }

                            result = ma_device_write__pulse(pDevice, playbackDeviceData, (ma_uint32)convertedDeviceFrameCount, NULL);   /* Safe cast. */
                            if (result != MA_SUCCESS) {
                                exitLoop = MA_TRUE;
                                break;
                            }

                            capturedClientFramesToProcessThisIteration -= (ma_uint32)convertedClientFrameCount;  /* Safe cast. */
                            if (capturedClientFramesToProcessThisIteration == 0) {
                                break;
                            }
                        }

                        /* In case an error happened from ma_device_write__pulse()... */
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }
                    }

                    totalCapturedDeviceFramesProcessed += capturedDeviceFramesProcessed;
                }
            } break;

            case ma_device_type_capture:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->capture.internalPeriodSizeInFrames;
                ma_uint32 framesReadThisPeriod = 0;
                while (framesReadThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesReadThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToReadThisIteration = framesRemainingInPeriod;
                    if (framesToReadThisIteration > intermediaryBufferSizeInFrames) {
                        framesToReadThisIteration = intermediaryBufferSizeInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, intermediaryBuffer, framesToReadThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    ma_device__send_frames_to_client(pDevice, framesProcessed, intermediaryBuffer);

                    framesReadThisPeriod += framesProcessed;
                }
            } break;

            case ma_device_type_playback:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->playback.internalPeriodSizeInFrames;
                ma_uint32 framesWrittenThisPeriod = 0;
                while (framesWrittenThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesWrittenThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToWriteThisIteration = framesRemainingInPeriod;
                    if (framesToWriteThisIteration > intermediaryBufferSizeInFrames) {
                        framesToWriteThisIteration = intermediaryBufferSizeInFrames;
                    }

                    ma_device__read_frames_from_client(pDevice, framesToWriteThisIteration, intermediaryBuffer);

                    result = ma_device_write__pulse(pDevice, intermediaryBuffer, framesToWriteThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    framesWrittenThisPeriod += framesProcessed;
                }
            } break;

            /* To silence a warning. Will never hit this. */
            case ma_device_type_loopback:
            default: break;
        }
    }

    /* Here is where the device needs to be stopped. */
    ma_device_stop__pulse(pDevice);

    return result;
}